

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenStructAccessor
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,
          ImportMap *imports)

{
  bool bVar1;
  char *prefix;
  undefined1 local_70 [8];
  Type vectortype_1;
  Type vectortype;
  ImportMap *imports_local;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  prefix = (char *)std::__cxx11::string::c_str();
  GenComment(&(field->super_Definition).doc_comment,code_ptr,
             (CommentConfig *)(anonymous_namespace)::def_comment,prefix);
  bVar1 = IsScalar((field->value).type.base_type);
  if (bVar1) {
    if ((struct_def->fixed & 1U) == 0) {
      GetScalarFieldOfTable(this,struct_def,field,code_ptr);
    }
    else {
      GetScalarFieldOfStruct(this,struct_def,field,code_ptr);
    }
  }
  else {
    switch((field->value).type.base_type) {
    case BASE_TYPE_STRING:
      GetStringField(this,struct_def,field,code_ptr,imports);
      break;
    case BASE_TYPE_VECTOR:
      Type::VectorType((Type *)&vectortype_1.fixed_length,&(field->value).type);
      if (vectortype_1._24_4_ == 0xf) {
        GetMemberOfVectorOfStruct(this,struct_def,field,code_ptr,imports);
      }
      else {
        GetMemberOfVectorOfNonStruct(this,struct_def,field,code_ptr);
        if (((((this->super_BaseGenerator).parser_)->opts).python_gen_numpy & 1U) != 0) {
          GetVectorOfNonStructAsNumpy(this,struct_def,field,code_ptr);
        }
        GetVectorAsNestedFlatbuffer(this,struct_def,field,code_ptr,imports);
      }
      break;
    case BASE_TYPE_STRUCT:
      if ((struct_def->fixed & 1U) == 0) {
        GetStructFieldOfTable(this,struct_def,field,code_ptr,imports);
      }
      else {
        GetStructFieldOfStruct(this,struct_def,field,code_ptr);
      }
      break;
    case BASE_TYPE_UNION:
      GetUnionField(this,struct_def,field,code_ptr,imports);
      break;
    case BASE_TYPE_ARRAY:
      Type::VectorType((Type *)local_70,&(field->value).type);
      if (local_70._0_4_ == BASE_TYPE_STRUCT) {
        GetArrayOfStruct(this,struct_def,field,code_ptr,imports);
      }
      else {
        GetArrayOfNonStruct(this,struct_def,field,code_ptr);
        if (((((this->super_BaseGenerator).parser_)->opts).python_gen_numpy & 1U) != 0) {
          GetVectorOfNonStructAsNumpy(this,struct_def,field,code_ptr);
        }
        GetVectorAsNestedFlatbuffer(this,struct_def,field,code_ptr,imports);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_python.cpp"
                    ,0x5d9,
                    "void flatbuffers::python::PythonGenerator::GenStructAccessor(const StructDef &, const FieldDef &, std::string *, ImportMap &) const"
                   );
    }
  }
  bVar1 = IsVector(&(field->value).type);
  if ((bVar1) || (bVar1 = IsArray(&(field->value).type), bVar1)) {
    GetVectorLen(this,struct_def,field,code_ptr);
    GetVectorIsNone(this,struct_def,field,code_ptr);
  }
  return;
}

Assistant:

void GenStructAccessor(const StructDef &struct_def, const FieldDef &field,
                         std::string *code_ptr, ImportMap &imports) const {
    GenComment(field.doc_comment, code_ptr, &def_comment, Indent.c_str());
    if (IsScalar(field.value.type.base_type)) {
      if (struct_def.fixed) {
        GetScalarFieldOfStruct(struct_def, field, code_ptr);
      } else {
        GetScalarFieldOfTable(struct_def, field, code_ptr);
      }
    } else {
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT:
          if (struct_def.fixed) {
            GetStructFieldOfStruct(struct_def, field, code_ptr);
          } else {
            GetStructFieldOfTable(struct_def, field, code_ptr, imports);
          }
          break;
        case BASE_TYPE_STRING:
          GetStringField(struct_def, field, code_ptr, imports);
          break;
        case BASE_TYPE_VECTOR: {
          auto vectortype = field.value.type.VectorType();
          if (vectortype.base_type == BASE_TYPE_STRUCT) {
            GetMemberOfVectorOfStruct(struct_def, field, code_ptr, imports);
          } else {
            GetMemberOfVectorOfNonStruct(struct_def, field, code_ptr);
            if (parser_.opts.python_gen_numpy) {
              GetVectorOfNonStructAsNumpy(struct_def, field, code_ptr);
            }
            GetVectorAsNestedFlatbuffer(struct_def, field, code_ptr, imports);
          }
          break;
        }
        case BASE_TYPE_ARRAY: {
          auto vectortype = field.value.type.VectorType();
          if (vectortype.base_type == BASE_TYPE_STRUCT) {
            GetArrayOfStruct(struct_def, field, code_ptr, imports);
          } else {
            GetArrayOfNonStruct(struct_def, field, code_ptr);
            if (parser_.opts.python_gen_numpy) {
              GetVectorOfNonStructAsNumpy(struct_def, field, code_ptr);
            }
            GetVectorAsNestedFlatbuffer(struct_def, field, code_ptr, imports);
          }
          break;
        }
        case BASE_TYPE_UNION:
          GetUnionField(struct_def, field, code_ptr, imports);
          break;
        default: FLATBUFFERS_ASSERT(0);
      }
    }
    if (IsVector(field.value.type) || IsArray(field.value.type)) {
      GetVectorLen(struct_def, field, code_ptr);
      GetVectorIsNone(struct_def, field, code_ptr);
    }
  }